

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

bool Rml::CombineAndDecompose(Transform *t,Element *e)

{
  pointer pTVar1;
  bool bVar2;
  ThisType *other;
  long lVar3;
  PrimitiveList *__range1;
  DecomposedMatrix4 *pDVar4;
  float *pfVar5;
  TransformPrimitive *primitive;
  pointer p;
  byte bVar6;
  Matrix4f m_primitive;
  Matrix4f m;
  DecomposedMatrix4 decomposed;
  
  bVar6 = 0;
  other = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity();
  Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Matrix4(&m,other);
  pTVar1 = (t->primitives).
           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p = (t->primitives).
           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>.
           _M_impl.super__Vector_impl_data._M_start; p != pTVar1; p = p + 1) {
    TransformUtilities::ResolveTransform(&m_primitive,p,e);
    Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*=(&m,&m_primitive);
  }
  decomposed.scale.y = 0.0;
  decomposed.scale.z = 0.0;
  decomposed.skew.x = 0.0;
  decomposed.skew.y = 0.0;
  decomposed.translation.x = 0.0;
  decomposed.translation.y = 0.0;
  decomposed.translation.z = 0.0;
  decomposed.scale.x = 0.0;
  decomposed.quaternion.x = 0.0;
  decomposed.quaternion.y = 0.0;
  decomposed.quaternion.z = 0.0;
  decomposed.quaternion.w = 0.0;
  decomposed.perspective.x = 0.0;
  decomposed.perspective.y = 0.0;
  decomposed.perspective.z = 0.0;
  decomposed.perspective.w = 0.0;
  decomposed.skew.z = 0.0;
  bVar2 = TransformUtilities::Decompose(&decomposed,&m);
  if (bVar2) {
    Transform::ClearPrimitives(t);
    m_primitive.vectors[0].x = 2.94273e-44;
    pDVar4 = &decomposed;
    pfVar5 = &m_primitive.vectors[0].y;
    for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pfVar5 = (pDVar4->perspective).x;
      pDVar4 = (DecomposedMatrix4 *)((long)pDVar4 + (ulong)bVar6 * -8 + 4);
      pfVar5 = pfVar5 + (ulong)bVar6 * -2 + 1;
    }
    Transform::AddPrimitive(t,(TransformPrimitive *)&m_primitive);
  }
  return bVar2;
}

Assistant:

static bool CombineAndDecompose(Transform& t, Element& e)
{
	Matrix4f m = Matrix4f::Identity();

	for (TransformPrimitive& primitive : t.GetPrimitives())
	{
		Matrix4f m_primitive = TransformUtilities::ResolveTransform(primitive, e);
		m *= m_primitive;
	}

	Transforms::DecomposedMatrix4 decomposed;

	if (!TransformUtilities::Decompose(decomposed, m))
		return false;

	t.ClearPrimitives();
	t.AddPrimitive(decomposed);

	return true;
}